

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_escaped_string<char,fmt::v10::appender>
                   (appender out,basic_string_view<char> str)

{
  iterator pcVar1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> __value;
  buffer<char> *in_RDI;
  bool bVar2;
  find_escape_result<char> *in_stack_00000020;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_00000028;
  find_escape_result<char> escape;
  iterator end;
  iterator begin;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar3;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  iterator pcVar4;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_30;
  undefined1 local_21;
  basic_string_view<char> local_20;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_10 [2];
  
  local_21 = 0x22;
  local_10[0].container = in_RDI;
  local_30.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_30);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             (value_type *)in_stack_ffffffffffffff78.container);
  basic_string_view<char>::begin(&local_20);
  pcVar1 = basic_string_view<char>::end(&local_20);
  do {
    find_escape(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffff88.container =
         (buffer<char> *)
         copy_str<char,char_const*>
                   ((char *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff78.container,in_stack_ffffffffffffff88.container);
    local_10[0].container = in_stack_ffffffffffffff88.container;
    if (in_stack_ffffffffffffffb0 == (iterator)0x0) break;
    pcVar4 = in_stack_ffffffffffffffb0;
    local_10[0].container =
         (buffer<char> *)
         write_escaped_cp<fmt::v10::appender,char>(in_stack_00000028.container,in_stack_00000020);
    bVar2 = in_stack_ffffffffffffffb0 != pcVar1;
    in_stack_ffffffffffffffb0 = pcVar4;
  } while (bVar2);
  uVar3 = 0x22;
  __value.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*
            ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)&stack0xffffffffffffff78);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
             CONCAT17(uVar3,in_stack_ffffffffffffff80),(value_type *)__value.container);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_10[0].container;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}